

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O1

void test_cpp_wrapper_all_records_random(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int i;
  long lVar1;
  int records [5];
  int local_38 [8];
  
  local_38[0] = -0x6f;
  local_38[1] = 0x71;
  local_38[2] = 5;
  local_38[3] = 0x32;
  local_38[4] = 0xffffff1f;
  lVar1 = 0;
  do {
    cpp_wrapper_insert(tc,dict,local_38[lVar1],local_38[lVar1],'\x01');
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  cpp_wrapper_all_records(tc,dict,local_38,5,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_all_records_random(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	int records[5]		= { -111, 113, 5, 50, -225 };
	int records_length	= sizeof(records) / sizeof(int);

	for (int i = 0; i < records_length; i++) {
		cpp_wrapper_insert(tc, dict, records[i], records[i], boolean_true);
	}

	cpp_wrapper_all_records(tc, dict, records, records_length, boolean_true);
}